

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

float ma_fader_get_current_volume(ma_fader *pFader)

{
  ma_fader *pFader_local;
  float r1;
  float r0;
  
  if (pFader == (ma_fader *)0x0) {
    pFader_local._0_4_ = 0.0;
  }
  else if (pFader->cursorInFrames == 0) {
    pFader_local._0_4_ = pFader->volumeBeg;
  }
  else if (pFader->cursorInFrames < pFader->lengthInFrames) {
    pFader_local._0_4_ =
         pFader->volumeBeg +
         (pFader->volumeEnd - pFader->volumeBeg) *
         ((float)(uint)pFader->cursorInFrames / (float)(uint)pFader->lengthInFrames);
  }
  else {
    pFader_local._0_4_ = pFader->volumeEnd;
  }
  return pFader_local._0_4_;
}

Assistant:

MA_API float ma_fader_get_current_volume(ma_fader* pFader)
{
    if (pFader == NULL) {
        return 0.0f;
    }

    /* The current volume depends on the position of the cursor. */
    if (pFader->cursorInFrames == 0) {
        return pFader->volumeBeg;
    } else if (pFader->cursorInFrames >= pFader->lengthInFrames) {
        return pFader->volumeEnd;
    } else {
        /* The cursor is somewhere inside the fading period. We can figure this out with a simple linear interpoluation between volumeBeg and volumeEnd based on our cursor position. */
        return ma_mix_f32_fast(pFader->volumeBeg, pFader->volumeEnd, (ma_uint32)pFader->cursorInFrames / (float)((ma_uint32)pFader->lengthInFrames));    /* Safe cast to uint32 because we clamp it in ma_fader_process_pcm_frames(). */
    }
}